

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O0

void PrintSerialPortIRQ(uint8_t irq)

{
  uint8_t irq_local;
  
  if (irq == '\0') {
    printf("Auto");
  }
  else if (irq == '\x01') {
    printf("No IRQ");
  }
  else if (irq == '\x02') {
    printf("Reserved");
  }
  else {
    printf("IRQ %d",(ulong)irq);
  }
  return;
}

Assistant:

void PrintSerialPortIRQ(uint8_t irq)
{
	switch(irq)
	{
	case 0:
		printf("Auto");
		break;
	case 1:
		printf("No IRQ");
		break;
	case 2:
		printf("Reserved");
		break;
	default:
		printf("IRQ %d", irq);
		break;
	}
}